

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

void computeAuxTape(randomTape_t *tapes,uint8_t *input_masks,picnic_instance_t *params)

{
  randomTape_t *lowmc;
  ushort *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t j;
  size_t i;
  size_t tapeSizeBytes;
  mzd_local_t lowmc_key [1];
  randomTape_t *in_stack_ffffffffffffff68;
  lowmc_key_t *key;
  undefined1 local_80 [8];
  size_t in_stack_ffffffffffffff88;
  mzd_local_t *in_stack_ffffffffffffff90;
  mzd_local_t *in_stack_ffffffffffffff98;
  
  memset(local_80,0,0x20);
  lowmc = (randomTape_t *)(long)(int)((uint)*(byte *)((long)in_RDX + 9) << 1);
  for (key = (lowmc_key_t *)0x0; key < (lowmc_key_t *)(ulong)*(byte *)((long)in_RDX + 0xb);
      key = (lowmc_key_t *)((long)key->w64 + 1)) {
    for (in_stack_ffffffffffffff68 = (randomTape_t *)0x0; in_stack_ffffffffffffff68 < lowmc;
        in_stack_ffffffffffffff68 = (randomTape_t *)((long)in_stack_ffffffffffffff68->tape + 1)) {
      *(byte *)((long)in_stack_ffffffffffffff68->tape + *(long *)(in_RDI + 0x88)) =
           *(byte *)((long)in_stack_ffffffffffffff68->tape + *(long *)(in_RDI + 0x88)) ^
           *(byte *)((long)in_stack_ffffffffffffff68->tape + *(long *)(in_RDI + (long)key * 8));
    }
  }
  mzd_from_char_array(in_stack_ffffffffffffff98,(uint8_t *)in_stack_ffffffffffffff90,
                      in_stack_ffffffffffffff88);
  *(uint *)(in_RDI + 0x90) = (uint)*in_RDX;
  *(undefined4 *)(in_RDI + 0x94) = 0;
  memset(*(void **)(in_RDI + 0x80),0,(ulong)*(byte *)((long)in_RDX + 9));
  lowmc_compute_aux((lowmc_parameters_t *)lowmc,key,in_stack_ffffffffffffff68);
  if (in_RSI != 0) {
    mzd_to_char_array((uint8_t *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                      in_stack_ffffffffffffff88);
  }
  *(undefined4 *)(in_RDI + 0x90) = 0;
  return;
}

Assistant:

static void computeAuxTape(randomTape_t* tapes, uint8_t* input_masks,
                           const picnic_instance_t* params) {
  mzd_local_t lowmc_key[1] = {0};

  size_t tapeSizeBytes = 2 * params->view_size;

  // combine into key shares and calculate lowmc evaluation in plain
  for (size_t i = 0; i < params->num_MPC_parties; i++) {
    for (size_t j = 0; j < tapeSizeBytes; j++) {
      tapes->parity_tapes[j] ^= tapes->tape[i][j];
    }
  }
  mzd_from_char_array(lowmc_key, tapes->parity_tapes, params->input_output_size);
  tapes->pos     = params->lowmc.n;
  tapes->aux_pos = 0;
  memset(tapes->aux_bits, 0, params->view_size);

  // Perform LowMC evaluation and fix AND masks for all AND gates
  lowmc_compute_aux(&params->lowmc, lowmc_key, tapes);

  // write the key masks to the input
  if (input_masks != NULL) {
    mzd_to_char_array(input_masks, lowmc_key, params->input_output_size);
  }

  // Reset the random tape counter so that the online execution uses the
  // same random bits as when computing the aux shares
  tapes->pos = 0;
}